

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics_accumulation.cc
# Opt level: O0

bool __thiscall
sptk::StatisticsAccumulation::Run
          (StatisticsAccumulation *this,vector<double,_std::allocator<double>_> *data,Buffer *buffer
          )

{
  double dVar1;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> __last1;
  int iVar2;
  size_type sVar3;
  double *pdVar4;
  const_reference pvVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  iterator iVar8;
  iterator iVar9;
  long in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  double z_1;
  int j_1;
  int i_1;
  int j;
  int i;
  double z;
  double n;
  double *delta;
  size_t length;
  undefined4 in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe7c;
  Row *in_stack_fffffffffffffe80;
  Row *this_00;
  anon_class_8_1_54a3981a in_stack_fffffffffffffe88;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe90;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea4;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffea8;
  int local_134;
  Row local_c0;
  int local_a4;
  int local_a0;
  Row local_90;
  int local_78;
  int local_74;
  double local_70;
  double local_68;
  reference local_60;
  double *local_58;
  double *local_48;
  double *local_40;
  double *local_38;
  double *local_30;
  size_type local_28;
  long local_20;
  vector<double,_std::allocator<double>_> *local_18;
  bool local_1;
  
  local_28 = (size_type)(*(int *)(in_RDI + 8) + 1);
  if ((((*(byte *)(in_RDI + 0x12) & 1) == 0) ||
      (local_20 = in_RDX, local_18 = in_RSI,
      sVar3 = std::vector<double,_std::allocator<double>_>::size(in_RSI), sVar3 != local_28)) ||
     (local_20 == 0)) {
    local_1 = false;
  }
  else {
    if ((0 < *(int *)(in_RDI + 0xc)) &&
       (sVar3 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(local_20 + 0x10)),
       sVar3 != local_28)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (size_type)in_stack_fffffffffffffe98._M_current);
    }
    if ((1 < *(int *)(in_RDI + 0xc)) &&
       (iVar2 = SymmetricMatrix::GetNumDimension((SymmetricMatrix *)(local_20 + 0x28)),
       iVar2 != (int)local_28)) {
      SymmetricMatrix::Resize
                ((SymmetricMatrix *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (int)((ulong)in_stack_fffffffffffffe98._M_current >> 0x20));
    }
    if (((*(byte *)(in_RDI + 0x11) & 1) != 0) &&
       (sVar3 = std::vector<double,_std::allocator<double>_>::size
                          ((vector<double,_std::allocator<double>_> *)(local_20 + 0x68)),
       sVar3 != local_28)) {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                 (size_type)in_stack_fffffffffffffe98._M_current);
    }
    *(int *)(local_20 + 8) = *(int *)(local_20 + 8) + 1;
    if ((0 < *(int *)(in_RDI + 0xc)) && ((*(byte *)(in_RDI + 0x11) & 1) != 0)) {
      local_30 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_38 = (double *)
                 std::vector<double,_std::allocator<double>_>::end
                           ((vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_40 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_48 = (double *)
                 std::vector<double,_std::allocator<double>_>::begin
                           ((vector<double,_std::allocator<double>_> *)
                            CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
      local_58 = (double *)
                 std::
                 transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::minus<double>>
                           (local_30,local_38,local_40,local_48);
    }
    local_60 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(local_20 + 0x68),0);
    if (1 < *(int *)(in_RDI + 0xc)) {
      if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
        for (local_a0 = 0; local_a0 <= *(int *)(in_RDI + 8); local_a0 = local_a0 + 1) {
          in_stack_fffffffffffffea4 = local_a0;
          local_a4 = local_a0;
          if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
            local_a4 = 0;
            in_stack_fffffffffffffea4 = local_a4;
          }
          for (; local_a4 <= local_a0; local_a4 = local_a4 + 1) {
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_18,(long)local_a0);
            this_00 = (Row *)*pvVar5;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (local_18,(long)local_a4);
            in_stack_fffffffffffffe88.z = *pvVar5;
            in_stack_fffffffffffffe90._M_current = (double *)&local_c0;
            SymmetricMatrix::operator[]
                      ((SymmetricMatrix *)in_stack_fffffffffffffe88.z,(int)((ulong)this_00 >> 0x20))
            ;
            in_stack_fffffffffffffe98._M_current =
                 SymmetricMatrix::Row::operator[](this_00,in_stack_fffffffffffffe7c);
            *in_stack_fffffffffffffe98._M_current =
                 (double)this_00 * in_stack_fffffffffffffe88.z +
                 *in_stack_fffffffffffffe98._M_current;
            SymmetricMatrix::Row::~Row(&local_c0);
          }
        }
      }
      else {
        local_68 = (double)*(int *)(local_20 + 8);
        local_70 = (local_68 - 1.0) / local_68;
        for (local_74 = 0; local_74 <= *(int *)(in_RDI + 8); local_74 = local_74 + 1) {
          if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
            local_134 = 0;
          }
          else {
            local_134 = local_74;
          }
          for (local_78 = local_134; local_78 <= local_74; local_78 = local_78 + 1) {
            in_stack_fffffffffffffea8._M_current = (double *)(local_70 * local_60[local_74]);
            dVar1 = local_60[local_78];
            SymmetricMatrix::operator[]
                      ((SymmetricMatrix *)in_stack_fffffffffffffe88.z,
                       (int)((ulong)in_stack_fffffffffffffe80 >> 0x20));
            pdVar4 = SymmetricMatrix::Row::operator[]
                               (in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c);
            *pdVar4 = (double)in_stack_fffffffffffffea8._M_current * dVar1 + *pdVar4;
            SymmetricMatrix::Row::~Row(&local_90);
          }
        }
      }
    }
    if (0 < *(int *)(in_RDI + 0xc)) {
      if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
        cVar6 = std::vector<double,_std::allocator<double>_>::begin
                          ((vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        cVar7 = std::vector<double,_std::allocator<double>_>::end
                          ((vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        iVar8 = std::vector<double,_std::allocator<double>_>::begin
                          ((vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        iVar9 = std::vector<double,_std::allocator<double>_>::begin
                          ((vector<double,_std::allocator<double>_> *)
                           CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        std::
        transform<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,std::plus<double>>
                  (cVar6._M_current,cVar7._M_current,iVar8._M_current,iVar9._M_current);
      }
      else {
        std::vector<double,_std::allocator<double>_>::begin
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        std::vector<double,_std::allocator<double>_>::end
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        std::vector<double,_std::allocator<double>_>::begin
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        std::vector<double,_std::allocator<double>_>::begin
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_fffffffffffffe7c,in_stack_fffffffffffffe78));
        __last1._M_current._4_4_ = in_stack_fffffffffffffea4;
        __last1._M_current._0_4_ = in_stack_fffffffffffffea0;
        std::
        transform<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::StatisticsAccumulation::Run(std::vector<double,std::allocator<double>>const&,sptk::StatisticsAccumulation::Buffer*)const::__0>
                  (in_stack_fffffffffffffea8,__last1,in_stack_fffffffffffffe98,
                   in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
      }
    }
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool StatisticsAccumulation::Run(const std::vector<double>& data,
                                 StatisticsAccumulation::Buffer* buffer) const {
  // Check inputs.
  const std::size_t length(num_order_ + 1);
  if (!is_valid_ || data.size() != length || NULL == buffer) {
    return false;
  }

  // Prepare memories.
  if (1 <= num_statistics_order_ &&
      buffer->first_order_statistics_.size() != length) {
    buffer->first_order_statistics_.resize(length);
  }
  if (2 <= num_statistics_order_ &&
      buffer->second_order_statistics_.GetNumDimension() !=
          static_cast<int>(length)) {
    buffer->second_order_statistics_.Resize(static_cast<int>(length));
  }
  if (numerically_stable_ && buffer->delta_.size() != length) {
    buffer->delta_.resize(length);
  }

  // Accumulate 0th order statistics.
  ++(buffer->zeroth_order_statistics_);

  // Compute delta.
  if (1 <= num_statistics_order_ && numerically_stable_) {
    std::transform(data.begin(), data.end(),
                   buffer->first_order_statistics_.begin(),
                   buffer->delta_.begin(), std::minus<double>());
  }
  const double* delta(&(buffer->delta_[0]));

  // Accumulate 2nd order statistics.
  if (2 <= num_statistics_order_) {
    if (numerically_stable_) {
      const double n(static_cast<double>(buffer->zeroth_order_statistics_));
      const double z((n - 1) / n);
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          buffer->second_order_statistics_[i][j] += z * delta[i] * delta[j];
        }
      }
    } else {
      for (int i(0); i <= num_order_; ++i) {
        for (int j(diagonal_ ? i : 0); j <= i; ++j) {
          buffer->second_order_statistics_[i][j] += data[i] * data[j];
        }
      }
    }
  }

  // Accumulate 1st order statistics.
  if (1 <= num_statistics_order_) {
    if (numerically_stable_) {
      const double z(1.0 / buffer->zeroth_order_statistics_);
      std::transform(buffer->delta_.begin(), buffer->delta_.end(),
                     buffer->first_order_statistics_.begin(),
                     buffer->first_order_statistics_.begin(),
                     [z](double d, double a) { return a + z * d; });
    } else {
      std::transform(
          data.begin(), data.end(), buffer->first_order_statistics_.begin(),
          buffer->first_order_statistics_.begin(), std::plus<double>());
    }
  }

  return true;
}